

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool list_reversed(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  gravity_class_t *pgVar3;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  char *local_1070;
  long local_1058;
  gravity_int_t i;
  uint32_t count;
  gravity_list_t *newlist;
  gravity_list_t *list;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs < 2) {
    pgVar1 = (args->field_1).p;
    aVar4.p = (gravity_object_t *)gravity_list_new(vm,(uint32_t)pgVar1->objclass);
    pgVar2 = pgVar1->objclass;
    for (local_1058 = 0; local_1058 < (long)((ulong)pgVar2 & 0xffffffff);
        local_1058 = local_1058 + 1) {
      if ((aVar4.p)->objclass == (gravity_class_t *)(aVar4.p)->identifier) {
        if ((aVar4.p)->identifier == (char *)0x0) {
          local_1070 = (char *)0x8;
        }
        else {
          local_1070 = (char *)((long)(aVar4.p)->identifier << 1);
        }
        (aVar4.p)->identifier = local_1070;
        pvVar5 = realloc(*(void **)&(aVar4.p)->has_outer,(long)(aVar4.p)->identifier << 4);
        *(void **)&(aVar4.p)->has_outer = pvVar5;
      }
      pgVar3 = (aVar4.p)->objclass;
      (aVar4.p)->objclass = (gravity_class_t *)((long)&pgVar3->isa + 1);
      puVar6 = (undefined8 *)(*(long *)&(aVar4.p)->has_outer + (long)pgVar3 * 0x10);
      puVar7 = (undefined8 *)
               (*(long *)&pgVar1->has_outer +
               ((((ulong)pgVar2 & 0xffffffff) - local_1058) + -1) * 0x10);
      *puVar6 = *puVar7;
      puVar6[1] = puVar7[1];
    }
    value.field_1.p = (gravity_object_t *)aVar4.n;
    value.isa = (aVar4.p)->isa;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"Incorrect number of arguments.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool list_reversed (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs > 1) RETURN_ERROR("Incorrect number of arguments.");
    
    // self parameter
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    gravity_list_t *newlist = gravity_list_new(vm, (uint32_t)list->array.n);
    uint32_t count = (uint32_t)marray_size(list->array);
    gravity_int_t i = 0;

    while (i < count) {
        marray_push(gravity_value_t, newlist->array, marray_get(list->array, count-i-1));
        ++i;
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(newlist), rindex);
}